

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O1

void mul_mat_gq_6(void *src0,void *src1,float *dst,int m,int n,int k)

{
  if ((k & 0x1fU) == 0) {
    if (0 < m) {
      do {
        if (0 < n) {
          memset(dst,0,(ulong)(uint)n << 2);
        }
        dst = dst + n;
        m = m + -1;
      } while (m != 0);
    }
    return;
  }
  __assert_fail("k % 32 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                ,0x931,"void mul_mat_gq_6(const void *, const void *, float *, int, int, int)");
}

Assistant:

void mul_mat_gq_6(
    const void * src0,
    const void * src1, // transposed
         float * dst,
    int m, int n, int k) {
    assert(k % 32 == 0);

    for (int ir0 = 0; ir0 < m; ir0++) {
        for (int ir1 = 0; ir1 < n; ir1++) {
            vec_dot_gq_6(k, dst + ir1, src0, src1);
            src1 = (const char *) src1 + quantize_6_row_size(k);
        }
        src0 = (const char *) src0 +   quantize_6_row_size(k);
        src1 = (const char *) src1 - n*quantize_6_row_size(k);

        dst = (float *) dst + n;
    }
}